

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevcd_fmt_conv.c
# Opt level: O2

void ihevcd_fmt_conv_420sp_to_420p
               (UWORD8 *pu1_y_src,UWORD8 *pu1_uv_src,UWORD8 *pu1_y_dst,UWORD8 *pu1_u_dst,
               UWORD8 *pu1_v_dst,WORD32 wd,WORD32 ht,WORD32 src_y_strd,WORD32 src_uv_strd,
               WORD32 dst_y_strd,WORD32 dst_uv_strd,WORD32 is_u_first,WORD32 disable_luma_copy)

{
  UWORD8 *pUVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  bool bVar7;
  
  if (disable_luma_copy == 0) {
    iVar6 = 0;
    if (0 < ht) {
      iVar6 = ht;
    }
    while (bVar7 = iVar6 != 0, iVar6 = iVar6 + -1, bVar7) {
      memcpy(pu1_y_dst,pu1_y_src,(long)wd);
      pu1_y_dst = pu1_y_dst + dst_y_strd;
      pu1_y_src = pu1_y_src + src_y_strd;
    }
  }
  pUVar1 = pu1_uv_src + 1;
  if (is_u_first == 0) {
    pUVar1 = pu1_uv_src;
    pu1_uv_src = pu1_uv_src + 1;
  }
  uVar3 = 0;
  uVar2 = (ulong)(uint)(wd >> 1);
  if (wd >> 1 < 1) {
    uVar2 = uVar3;
  }
  uVar5 = (ulong)(uint)(ht >> 1);
  if (ht >> 1 < 1) {
    uVar5 = uVar3;
  }
  for (; (int)uVar3 != (int)uVar5; uVar3 = (ulong)((int)uVar3 + 1)) {
    for (uVar4 = 0; uVar2 != uVar4; uVar4 = uVar4 + 1) {
      pu1_u_dst[uVar4] = pu1_uv_src[uVar4 * 2];
      pu1_v_dst[uVar4] = pUVar1[uVar4 * 2];
    }
    pu1_u_dst = pu1_u_dst + dst_uv_strd;
    pu1_v_dst = pu1_v_dst + dst_uv_strd;
    pu1_uv_src = pu1_uv_src + src_uv_strd;
    pUVar1 = pUVar1 + src_uv_strd;
  }
  return;
}

Assistant:

void ihevcd_fmt_conv_420sp_to_420p(UWORD8 *pu1_y_src,
                                   UWORD8 *pu1_uv_src,
                                   UWORD8 *pu1_y_dst,
                                   UWORD8 *pu1_u_dst,
                                   UWORD8 *pu1_v_dst,
                                   WORD32 wd,
                                   WORD32 ht,
                                   WORD32 src_y_strd,
                                   WORD32 src_uv_strd,
                                   WORD32 dst_y_strd,
                                   WORD32 dst_uv_strd,
                                   WORD32 is_u_first,
                                   WORD32 disable_luma_copy)
{
    UWORD8 *pu1_src, *pu1_dst;
    UWORD8 *pu1_u_src, *pu1_v_src;
    WORD32 num_rows, num_cols, src_strd, dst_strd;
    WORD32 i, j;

    if(0 == disable_luma_copy)
    {
        /* copy luma */
        pu1_src = (UWORD8 *)pu1_y_src;
        pu1_dst = (UWORD8 *)pu1_y_dst;

        num_rows = ht;
        num_cols = wd;

        src_strd = src_y_strd;
        dst_strd = dst_y_strd;

        for(i = 0; i < num_rows; i++)
        {
            memcpy(pu1_dst, pu1_src, num_cols);
            pu1_dst += dst_strd;
            pu1_src += src_strd;
        }
    }
    /* de-interleave U and V and copy to destination */
    if(is_u_first)
    {
        pu1_u_src = (UWORD8 *)pu1_uv_src;
        pu1_v_src = (UWORD8 *)pu1_uv_src + 1;
    }
    else
    {
        pu1_u_src = (UWORD8 *)pu1_uv_src + 1;
        pu1_v_src = (UWORD8 *)pu1_uv_src;
    }


    num_rows = ht >> 1;
    num_cols = wd >> 1;

    src_strd = src_uv_strd;
    dst_strd = dst_uv_strd;

    for(i = 0; i < num_rows; i++)
    {
        for(j = 0; j < num_cols; j++)
        {
            pu1_u_dst[j] = pu1_u_src[j * 2];
            pu1_v_dst[j] = pu1_v_src[j * 2];
        }

        pu1_u_dst += dst_strd;
        pu1_v_dst += dst_strd;
        pu1_u_src += src_strd;
        pu1_v_src += src_strd;
    }
    return;
}